

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

hash hash_callback_str(hash_key key)

{
  hash h;
  char *str;
  hash_key key_local;
  
  h = 0x1505;
  str = (char *)key;
  while (*str != '\0') {
    h = h * 0x21 + (long)str[1];
    str = str + 1;
  }
  return h;
}

Assistant:

hash hash_callback_str(const hash_key key)
{
	/* djb2 */
	const char *str = (const char *)key;

	hash h = 0x1505;

	while (*str++ != '\0')
	{
		h = (hash)(((h << 5) + h) + *str);
	}

	return h;
}